

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5SpecialMatch(Fts5FullTable *pTab,Fts5Cursor *pCsr,char *zQuery)

{
  int iVar1;
  char *pcVar2;
  char *in_RDX;
  long in_RSI;
  long in_RDI;
  bool bVar3;
  int n;
  char *z;
  int rc;
  uint local_2c;
  char *local_28;
  int local_1c;
  
  local_1c = 0;
  for (local_28 = in_RDX; *local_28 == ' '; local_28 = local_28 + 1) {
  }
  local_2c = 0;
  while( true ) {
    bVar3 = false;
    if (local_28[(int)local_2c] != '\0') {
      bVar3 = local_28[(int)local_2c] != ' ';
    }
    if (!bVar3) break;
    local_2c = local_2c + 1;
  }
  *(undefined4 *)(in_RSI + 0x20) = 3;
  if ((local_2c == 5) && (iVar1 = sqlite3_strnicmp("reads",local_28,5), iVar1 == 0)) {
    iVar1 = sqlite3Fts5IndexReads(*(Fts5Index **)(in_RDI + 0x20));
    *(long *)(in_RSI + 0x58) = (long)iVar1;
  }
  else if ((local_2c == 2) && (iVar1 = sqlite3_strnicmp("id",local_28,2), iVar1 == 0)) {
    *(undefined8 *)(in_RSI + 0x58) = *(undefined8 *)(in_RSI + 0x18);
  }
  else {
    pcVar2 = sqlite3_mprintf("unknown special query: %.*s",(ulong)local_2c,local_28);
    *(char **)(in_RDI + 0x10) = pcVar2;
    local_1c = 1;
  }
  return local_1c;
}

Assistant:

static int fts5SpecialMatch(
  Fts5FullTable *pTab,
  Fts5Cursor *pCsr,
  const char *zQuery
){
  int rc = SQLITE_OK;             /* Return code */
  const char *z = zQuery;         /* Special query text */
  int n;                          /* Number of bytes in text at z */

  while( z[0]==' ' ) z++;
  for(n=0; z[n] && z[n]!=' '; n++);

  assert( pTab->p.base.zErrMsg==0 );
  pCsr->ePlan = FTS5_PLAN_SPECIAL;

  if( n==5 && 0==sqlite3_strnicmp("reads", z, n) ){
    pCsr->iSpecial = sqlite3Fts5IndexReads(pTab->p.pIndex);
  }
  else if( n==2 && 0==sqlite3_strnicmp("id", z, n) ){
    pCsr->iSpecial = pCsr->iCsrId;
  }
  else{
    /* An unrecognized directive. Return an error message. */
    pTab->p.base.zErrMsg = sqlite3_mprintf("unknown special query: %.*s", n, z);
    rc = SQLITE_ERROR;
  }

  return rc;
}